

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O0

void filetree_remove_common_prefix(GSList *files)

{
  char *__s;
  char *shortest_dir_name;
  string_plus_length common_prefix;
  string_plus_length spl;
  GSList *files_local;
  
  common_prefix.length = 0;
  if (files != (GSList *)0x0) {
    g_slist_foreach(files,get_shortest_string,&common_prefix.length);
    __s = (char *)g_path_get_dirname(common_prefix.length);
    shortest_dir_name = __s;
    common_prefix.string = (char *)strlen(__s);
    g_slist_foreach(files,find_common_prefix,&shortest_dir_name);
    g_slist_foreach(files,remove_prefix,&common_prefix);
    g_free(__s);
  }
  return;
}

Assistant:

void filetree_remove_common_prefix(GSList *files) {
    struct string_plus_length spl = { NULL, (size_t) -1 }, common_prefix;
    char *shortest_dir_name;

    if (!files) return;
    g_slist_foreach(files, get_shortest_string, &spl);
    common_prefix.string = shortest_dir_name = g_path_get_dirname(spl.string);
    common_prefix.length = strlen(common_prefix.string);
    g_slist_foreach(files, (GFunc) find_common_prefix, &common_prefix);
    g_slist_foreach(files, (GFunc) remove_prefix, &common_prefix.length);

    g_free(shortest_dir_name);
}